

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  bool bVar2;
  Limit limit;
  int iVar3;
  int64_t iVar4;
  ulong uVar5;
  int *piVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  byte *ptr;
  ulong uVar12;
  int tmp;
  uint32_t first_byte_or_zero;
  
  pbVar7 = input->buffer_;
  if (pbVar7 < input->buffer_end_) {
    uVar11 = (uint)*pbVar7;
    if (-1 < (char)*pbVar7) {
      input->buffer_ = pbVar7 + 1;
      goto LAB_0033568f;
    }
  }
  else {
    uVar11 = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
  uVar11 = (uint)iVar4;
  if (iVar4 < 0) {
    return false;
  }
LAB_0033568f:
  limit = io::CodedInputStream::PushLimit(input,uVar11);
  iVar3 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar3) {
    uVar11 = field_number << 3;
    do {
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (ulong)bVar1;
        first_byte_or_zero = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003356e4;
        input->buffer_ = pbVar7 + 1;
      }
      else {
        first_byte_or_zero = 0;
LAB_003356e4:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        if ((long)uVar5 < 0) {
          return false;
        }
      }
      uVar9 = (uint)uVar5;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar2 = (*is_valid)(uVar9), bVar2)) {
        uVar8 = values->current_size_;
        if (uVar8 == values->total_size_) {
          RepeatedField<int>::Reserve(values,uVar8 + 1);
          piVar6 = RepeatedField<int>::elements(values);
          piVar6[uVar8] = uVar9;
        }
        else {
          piVar6 = RepeatedField<int>::elements(values);
          piVar6[uVar8] = uVar9;
        }
        values->current_size_ = uVar8 + 1;
      }
      else {
        pbVar7 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        unknown_fields_stream->cur_ = pbVar7;
        *pbVar7 = (byte)uVar11;
        if (uVar11 < 0x80) {
          ptr = pbVar7 + 1;
        }
        else {
          ptr = pbVar7 + 2;
          *pbVar7 = (byte)uVar11 | 0x80;
          pbVar7[1] = (byte)(uVar11 >> 7);
          if (0x3fff < uVar11) {
            uVar12 = (ulong)pbVar7[1];
            uVar10 = (ulong)(uVar11 >> 7);
            do {
              ptr[-1] = (byte)uVar12 | 0x80;
              uVar12 = uVar10 >> 7;
              *ptr = (byte)uVar12;
              ptr = ptr + 1;
              uVar8 = (uint)uVar10;
              uVar10 = uVar12;
            } while (0x3fff < uVar8);
          }
        }
        unknown_fields_stream->cur_ = ptr;
        if ((unknown_fields_stream->impl_).end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&unknown_fields_stream->impl_,ptr);
        }
        unknown_fields_stream->cur_ = ptr;
        *ptr = (byte)uVar5;
        if (uVar9 < 0x80) {
          pbVar7 = ptr + 1;
        }
        else {
          *ptr = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7 & 0x1ffffff;
          ptr[1] = (byte)uVar5;
          pbVar7 = ptr + 2;
          if (0x3fff < uVar9) {
            uVar12 = (ulong)ptr[1];
            do {
              pbVar7[-1] = (byte)uVar12 | 0x80;
              uVar12 = uVar5 >> 7;
              *pbVar7 = (byte)uVar12;
              pbVar7 = pbVar7 + 1;
              uVar9 = (uint)uVar5;
              uVar5 = uVar12;
            } while (0x3fff < uVar9);
          }
        }
        unknown_fields_stream->cur_ = pbVar7;
      }
      iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar3);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      uint32_t tag = WireFormatLite::MakeTag(field_number,
                                             WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}